

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::IFF_Layer2::Decode(IFF_Layer2 *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  ushort uVar2;
  KException *this_00;
  KDataStream *stream_00;
  IFF_ATC_NAVAIDS_FundamentalParameterData local_80;
  byte local_56;
  undefined1 local_55;
  KUINT8 i;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  IFF_Layer2 *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x1c) {
    local_55 = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    local_55 = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::
  vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
  ::clear(&this->m_vFPD);
  if ((local_19 & 1) == 0) {
    LayerHeader::Decode(&this->super_LayerHeader,pKStack_18);
  }
  stream_00 = operator>>(pKStack_18,&(this->m_BmDt).super_DataTypeBase);
  operator>>(stream_00,&(this->m_SOD).super_DataTypeBase);
  local_56 = 0;
  while( true ) {
    uVar2 = (ushort)local_56;
    KVar1 = SecondaryOperationalData::GetNumberOfFundamentalParamSets(&this->m_SOD);
    if (KVar1 <= uVar2) break;
    IFF_ATC_NAVAIDS_FundamentalParameterData::IFF_ATC_NAVAIDS_FundamentalParameterData
              (&local_80,pKStack_18);
    std::
    vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
    ::push_back(&this->m_vFPD,&local_80);
    IFF_ATC_NAVAIDS_FundamentalParameterData::~IFF_ATC_NAVAIDS_FundamentalParameterData(&local_80);
    local_56 = local_56 + 1;
  }
  return;
}

Assistant:

void IFF_Layer2::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( stream.GetBufferSize() < IFF_LAYER2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vFPD.clear();

	if( !ignoreHeader )
	{
		LayerHeader::Decode( stream );
	}

    stream >> KDIS_STREAM m_BmDt
           >> KDIS_STREAM m_SOD;

    for( KUINT8 i = 0; i < m_SOD.GetNumberOfFundamentalParamSets(); ++i )
    {
        m_vFPD.push_back( IFF_ATC_NAVAIDS_FundamentalParameterData( stream ) );
    }
}